

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmutil.c
# Opt level: O2

PmError Pm_Enqueue(PmQueue *q,void *msg)

{
  int iVar1;
  undefined4 *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined4 *puVar6;
  PmError PVar7;
  
  if (q == (PmQueue *)0x0) {
    PVar7 = pmBadPtr;
  }
  else {
    PVar7 = pmBufferOverflow;
    if (*(long *)((long)q + 0x18) == 0) {
      iVar1 = Pm_QueueFull(q);
      lVar3 = *(long *)((long)q + 8);
      if (iVar1 == 0) {
        puVar2 = (undefined4 *)(lVar3 * 4 + *(long *)((long)q + 0x28));
        lVar5 = 4;
        puVar6 = puVar2;
        for (lVar4 = 1; lVar4 < *(int *)((long)q + 0x20); lVar4 = lVar4 + 1) {
          iVar1 = *(int *)((long)msg + lVar4 * 4 + -4);
          if (iVar1 == 0) {
            *puVar6 = (int)lVar4;
            puVar6 = (undefined4 *)((long)puVar2 + lVar5);
          }
          else {
            puVar2[lVar4] = iVar1;
          }
          lVar5 = lVar5 + 4;
        }
        *puVar6 = (int)lVar4;
        lVar3 = lVar3 + *(int *)((long)q + 0x20);
        PVar7 = pmNoData;
        lVar4 = 0;
        if (lVar3 != *(long *)((long)q + 0x10)) {
          lVar4 = lVar3;
        }
        *(long *)((long)q + 8) = lVar4;
      }
      else {
        *(long *)((long)q + 0x18) = lVar3 + 1;
      }
    }
  }
  return PVar7;
}

Assistant:

PMEXPORT PmError Pm_Enqueue(PmQueue *q, void *msg)
{
    PmQueueRep *queue = (PmQueueRep *) q;
    long tail;
    int i;
    int32_t *src = (int32_t *) msg;
    int32_t *ptr;
    int32_t *dest;
    int rslt;
    if (!queue) 
        return pmBadPtr;
    /* no more enqueue until receiver acknowledges overflow */
    if (queue->overflow) return pmBufferOverflow;
    rslt = Pm_QueueFull(q);
    /* already checked above: if (rslt == pmBadPtr) return rslt; */
    tail = queue->tail;
    if (rslt) {
        queue->overflow = tail + 1;
        return pmBufferOverflow;
    }

    /* queue is has room for message, and overflow flag is cleared */
    ptr = &queue->buffer[tail];
    dest = ptr + 1;
    for (i = 1; i < queue->msg_size; i++) {
        int32_t j = src[i - 1];
        if (!j) {
            *ptr = i;
            ptr = dest;
        } else {
            *dest = j;
        }
        dest++;
    }
    *ptr = i;
    tail += queue->msg_size;
    if (tail == queue->len) tail = 0;
    queue->tail = tail;
    return pmNoError;
}